

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCommentWriter.cpp
# Opt level: O2

EStatusCodeAndObjectIDType __thiscall
PDFCommentWriter::WriteCommentsTree
          (PDFCommentWriter *this,PDFComment *inComment,
          PDFCommentToObjectIDTypeMap *inCommentsContext)

{
  EStatusCode EVar1;
  iterator iVar2;
  ObjectsContext *this_00;
  _Base_ptr p_Var3;
  DictionaryContext *this_01;
  string *psVar4;
  uchar *puVar5;
  Trace *this_02;
  ulong uVar7;
  char *inFormat;
  EStatusCodeAndObjectIDType EVar8;
  allocator<char> local_61;
  PDFRectangle local_60;
  PDFComment *inComment_local;
  double local_38;
  double dVar6;
  
  inComment_local = inComment;
  iVar2 = std::
          _Rb_tree<PDFComment_*,_std::pair<PDFComment_*const,_unsigned_long>,_std::_Select1st<std::pair<PDFComment_*const,_unsigned_long>_>,_std::less<PDFComment_*>,_std::allocator<std::pair<PDFComment_*const,_unsigned_long>_>_>
          ::find(&inCommentsContext->_M_t,&inComment_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(inCommentsContext->_M_t)._M_impl.super__Rb_tree_header)
  {
    uVar7 = 0xffffffffffffffff;
    if (inComment_local->ReplyTo == (PDFComment *)0x0) {
      dVar6 = 0.0;
    }
    else {
      EVar8 = WriteCommentsTree(this,inComment_local->ReplyTo,inCommentsContext);
      dVar6 = (double)EVar8.second;
      if (EVar8.first != eSuccess) {
        p_Var3 = (_Base_ptr)0x0;
        goto LAB_0016bc29;
      }
    }
    this_00 = PDFWriter::GetObjectsContext(this->mPDFWriter);
    p_Var3 = (_Base_ptr)ObjectsContext::StartNewIndirectObject(this_00);
    if (p_Var3 == (_Base_ptr)0x0) {
      this_02 = Trace::DefaultTrace();
      inFormat = "PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary";
      p_Var3 = (_Base_ptr)0x0;
    }
    else {
      this_01 = ObjectsContext::StartDictionary(this_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Type",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Annot",&local_61);
      DictionaryContext::WriteNameValue(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Subtype",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Text",&local_61);
      DictionaryContext::WriteNameValue(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Rect",&local_61);
      local_38 = dVar6;
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      PDFRectangle::PDFRectangle
                (&local_60,inComment_local->FrameBoundings[0],inComment_local->FrameBoundings[1],
                 inComment_local->FrameBoundings[2],inComment_local->FrameBoundings[3]);
      DictionaryContext::WriteRectangleValue(this_01,&local_60);
      PDFRectangle::~PDFRectangle(&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Contents",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      PDFTextString::PDFTextString((PDFTextString *)&local_60,&inComment_local->Text);
      psVar4 = PDFTextString::ToString_abi_cxx11_((PDFTextString *)&local_60);
      DictionaryContext::WriteLiteralStringValue(this_01,psVar4);
      PDFTextString::~PDFTextString((PDFTextString *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"C",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      ObjectsContext::StartArray(this_00);
      if ((inComment_local->Color).UseCMYK == true) {
        ObjectsContext::WriteDouble
                  (this_00,(double)(inComment_local->Color).CMYKComponents[0] / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  (this_00,(double)(inComment_local->Color).CMYKComponents[1] / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  (this_00,(double)(inComment_local->Color).CMYKComponents[2] / 255.0,
                   eTokenSeparatorSpace);
        puVar5 = (inComment_local->Color).CMYKComponents + 3;
      }
      else {
        ObjectsContext::WriteDouble
                  (this_00,(double)(inComment_local->Color).RGBComponents[0] / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  (this_00,(double)(inComment_local->Color).RGBComponents[1] / 255.0,
                   eTokenSeparatorSpace);
        puVar5 = (inComment_local->Color).RGBComponents + 2;
      }
      ObjectsContext::WriteDouble(this_00,(double)*puVar5 / 255.0,eTokenSeparatorSpace);
      ObjectsContext::EndArray(this_00,eTokenSeparatorEndLine);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"T",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      PDFTextString::PDFTextString((PDFTextString *)&local_60,&inComment_local->CommentatorName);
      psVar4 = PDFTextString::ToString_abi_cxx11_((PDFTextString *)&local_60);
      DictionaryContext::WriteLiteralStringValue(this_01,psVar4);
      PDFTextString::~PDFTextString((PDFTextString *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"M",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      PDFDate::ToString_abi_cxx11_((string *)&local_60,&inComment_local->Time);
      DictionaryContext::WriteLiteralStringValue(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (inComment_local->ReplyTo != (PDFComment *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"IRT",&local_61);
        DictionaryContext::WriteKey(this_01,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        local_60.LowerLeftX = local_38;
        local_60.LowerLeftY = 0.0;
        DictionaryContext::WriteObjectReferenceValue(this_01,(ObjectReference *)&local_60);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"RT",&local_61);
        DictionaryContext::WriteKey(this_01,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"R",&local_61);
        DictionaryContext::WriteNameValue(this_01,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Open",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      DictionaryContext::WriteBooleanValue(this_01,false);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Name",&local_61);
      DictionaryContext::WriteKey(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Comment",&local_61);
      DictionaryContext::WriteNameValue(this_01,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      EVar1 = ObjectsContext::EndDictionary(this_00,this_01);
      if (EVar1 == eSuccess) {
        ObjectsContext::EndIndirectObject(this_00);
        local_60.LowerLeftX = (double)inComment_local;
        local_60.LowerLeftY = (double)p_Var3;
        std::
        _Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<PDFComment*const,unsigned_long>>
                  ((_Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
                    *)inCommentsContext,(pair<PDFComment_*const,_unsigned_long> *)&local_60);
        goto LAB_0016b706;
      }
      this_02 = Trace::DefaultTrace();
      inFormat = "PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary";
    }
    Trace::TraceToLog(this_02,inFormat);
  }
  else {
    p_Var3 = iVar2._M_node[1]._M_parent;
LAB_0016b706:
    uVar7 = 0;
  }
LAB_0016bc29:
  EVar8._0_8_ = uVar7 & 0xffffffff;
  EVar8.second = (unsigned_long)p_Var3;
  return EVar8;
}

Assistant:

EStatusCodeAndObjectIDType PDFCommentWriter::WriteCommentsTree(PDFComment* inComment,PDFCommentToObjectIDTypeMap& inCommentsContext)
{
	EStatusCodeAndObjectIDType result;
	ObjectIDType repliedTo = 0;

	// if already written, return
	PDFCommentToObjectIDTypeMap::iterator it = inCommentsContext.find(inComment);
	if(it != inCommentsContext.end())
	{
		result.first = eSuccess;
		result.second = it->second;
		return result;
	}

	// if has a referred comment, write it first
	if(inComment->ReplyTo != NULL)
	{
		EStatusCodeAndObjectIDType repliedtoResult = WriteCommentsTree(inComment->ReplyTo,inCommentsContext);

		if(repliedtoResult.first != eSuccess)
		{
			result.first = eFailure;
			result.second = 0;
			return result;
		}
		else
			repliedTo = repliedtoResult.second;
	}

	do
	{
		ObjectsContext& objectsContext = mPDFWriter->GetObjectsContext();

		// Start new InDirect object for annotation dictionary
		result.second = objectsContext.StartNewIndirectObject();
		if(result.second == 0)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary");
			break;
		}
		
		DictionaryContext* dictionaryContext = objectsContext.StartDictionary();


		// Type
		dictionaryContext->WriteKey("Type");
		dictionaryContext->WriteNameValue("Annot");

		// SubType
		dictionaryContext->WriteKey("Subtype");
		dictionaryContext->WriteNameValue("Text");

		// Rect
		dictionaryContext->WriteKey("Rect");
		dictionaryContext->WriteRectangleValue(
			PDFRectangle(inComment->FrameBoundings[0],
						 inComment->FrameBoundings[1],
						 inComment->FrameBoundings[2],
						 inComment->FrameBoundings[3]));

		// Contents 
		dictionaryContext->WriteKey("Contents");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->Text).ToString());

		// C (color)
		dictionaryContext->WriteKey("C");
		objectsContext.StartArray();
		if(inComment->Color.UseCMYK)
		{
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[2]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[3]/255);
		}
		else
		{
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[2]/255);
		}
		objectsContext.EndArray(eTokenSeparatorEndLine);

		// T
		dictionaryContext->WriteKey("T");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->CommentatorName).ToString());
		
		// M
		dictionaryContext->WriteKey("M");
		dictionaryContext->WriteLiteralStringValue(inComment->Time.ToString());

		if(inComment->ReplyTo != NULL)
		{
			// IRT
			dictionaryContext->WriteKey("IRT");
			dictionaryContext->WriteObjectReferenceValue(repliedTo);

			// RT (we're doing always "reply" at this point, being a reply to comment
			dictionaryContext->WriteKey("RT");
			dictionaryContext->WriteNameValue("R");
		}

		// Open (we'll have them all closed to begin with)
		dictionaryContext->WriteKey("Open");
		dictionaryContext->WriteBooleanValue(false);

		// Name
		dictionaryContext->WriteKey("Name");
		dictionaryContext->WriteNameValue("Comment");

		if(objectsContext.EndDictionary(dictionaryContext) != eSuccess)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary");
			break;
		}
		objectsContext.EndIndirectObject();
	
		inCommentsContext.insert(PDFCommentToObjectIDTypeMap::value_type(inComment,result.second));

		result.first = eSuccess;
	}while(false);
	
	return result;
}